

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64.c
# Opt level: O1

roaring64_bitmap_t * roaring64_bitmap_from_range(uint64_t min,uint64_t max,uint64_t step)

{
  int32_t size;
  roaring64_bitmap_t *r;
  array_container_t *arr;
  art_val_t *val;
  uint min_00;
  art_key_chunk_t unaff_R13B;
  uint16_t step_00;
  uint32_t max_00;
  ulong uVar1;
  uint8_t high48 [6];
  uint local_48;
  ushort local_44;
  uint64_t local_40;
  long local_38;
  
  if (min < max && step != 0) {
    r = (roaring64_bitmap_t *)roaring_malloc(0x10);
    (r->art).root = (art_node_t *)0x0;
    r->flags = '\0';
    if (step < 0x10000) {
      local_38 = step - 1;
      step_00 = (uint16_t)step;
      local_40 = max;
      do {
        uVar1 = local_40 - (min & 0xffffffffffff0000);
        if (0xffff < uVar1) {
          uVar1 = 0x10000;
        }
        min_00 = (uint)min & 0xffff;
        max_00 = (uint32_t)uVar1;
        if (step_00 == 0) {
          arr = (array_container_t *)0x0;
        }
        else if (((uint)step & 0xffff) == 1) {
          if ((max_00 - min_00) + 1 < 3) {
            arr = array_container_create_range(min_00,max_00);
LAB_00103519:
            unaff_R13B = '\x02';
          }
          else {
            arr = (array_container_t *)run_container_create_given_capacity(1);
            unaff_R13B = '\x03';
            if (arr != (array_container_t *)0x0) {
              *(uint *)(arr->array + (long)arr->cardinality * 2) =
                   (~(uint)min + max_00) * 0x10000 | min_00;
              arr->cardinality = arr->cardinality + 1;
            }
          }
        }
        else {
          size = (int32_t)((ulong)(~min_00 + (uint)step + max_00) / (step & 0xffffffff));
          if (size < 0x1001) {
            arr = array_container_create_given_capacity(size);
            array_container_add_from_range(arr,min_00,max_00,step_00);
            goto LAB_00103519;
          }
          arr = (array_container_t *)bitset_container_create();
          bitset_container_add_from_range((bitset_container_t *)arr,min_00,max_00,step_00);
          unaff_R13B = '\x01';
        }
        local_48 = (uint)(byte)(min >> 0x38) | ((uint)(min >> 0x20) & 0xff0000) >> 8 |
                   (uint)(min >> 0x18) & 0xff0000 | (uint)(min >> 8) & 0xff000000;
        local_44 = (ushort)(min >> 0x18) & 0xff | (ushort)(min >> 8) & 0xff00;
        val = (art_val_t *)roaring_malloc(0x10);
        *(array_container_t **)(val[1].key + 2) = arr;
        val[1].key[0] = unaff_R13B;
        art_insert((art_t *)r,(art_key_chunk_t *)&local_48,val);
        uVar1 = (ulong)(max_00 - min_00) + local_38;
        uVar1 = uVar1 - uVar1 % step;
      } while ((min <= ~uVar1) && (min = min + uVar1, min < local_40));
    }
    else if (min < max) {
      do {
        roaring64_bitmap_add(r,min);
        if (~step < min) {
          return r;
        }
        min = min + step;
      } while (min < max);
    }
  }
  else {
    r = (roaring64_bitmap_t *)0x0;
  }
  return r;
}

Assistant:

roaring64_bitmap_t *roaring64_bitmap_from_range(uint64_t min, uint64_t max,
                                                uint64_t step) {
    if (step == 0 || max <= min) {
        return NULL;
    }
    roaring64_bitmap_t *r = roaring64_bitmap_create();
    if (step >= (1 << 16)) {
        // Only one value per container.
        for (uint64_t value = min; value < max; value += step) {
            roaring64_bitmap_add(r, value);
            if (value > UINT64_MAX - step) {
                break;
            }
        }
        return r;
    }
    do {
        uint64_t high_bits = min & 0xFFFFFFFFFFFF0000;
        uint16_t container_min = min & 0xFFFF;
        uint32_t container_max = (uint32_t)minimum(max - high_bits, 1 << 16);

        uint8_t typecode;
        container_t *container = container_from_range(
            &typecode, container_min, container_max, (uint16_t)step);

        uint8_t high48[ART_KEY_BYTES];
        split_key(min, high48);
        leaf_t *leaf = create_leaf(container, typecode);
        art_insert(&r->art, high48, (art_val_t *)leaf);

        uint64_t gap = container_max - container_min + step - 1;
        uint64_t increment = gap - (gap % step);
        if (min > UINT64_MAX - increment) {
            break;
        }
        min += increment;
    } while (min < max);
    return r;
}